

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Materials.cpp
# Opt level: O0

SP __thiscall pbrt::SemanticParser::createMaterial_disney(SemanticParser *this,SP *in)

{
  byte bVar1;
  element_type *peVar2;
  element_type *name;
  element_type *peVar3;
  element_type *__a;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  SP SVar8;
  SP mat;
  undefined7 in_stack_fffffffffffffc28;
  undefined4 in_stack_fffffffffffffc58;
  undefined4 in_stack_fffffffffffffc5c;
  allocator<char> *in_stack_fffffffffffffc60;
  char *in_stack_fffffffffffffc68;
  allocator<char> *__s;
  undefined4 in_stack_fffffffffffffc70;
  undefined4 in_stack_fffffffffffffc74;
  undefined8 in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd4;
  ParamSet *in_stack_fffffffffffffcd8;
  string *in_stack_fffffffffffffd08;
  float *in_stack_fffffffffffffd10;
  undefined4 in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd1c;
  undefined1 fallBack;
  ParamSet *this_00;
  allocator<char> local_261;
  string local_260 [39];
  allocator<char> local_239;
  string local_238 [39];
  allocator<char> local_211;
  string local_210 [39];
  allocator<char> local_1e9;
  string local_1e8 [39];
  allocator<char> local_1c1;
  string local_1c0 [39];
  allocator<char> local_199;
  string local_198 [39];
  allocator<char> local_171;
  string local_170 [39];
  allocator<char> local_149;
  string local_148 [39];
  allocator<char> local_121;
  string local_120 [39];
  allocator<char> local_f9;
  string local_f8 [39];
  undefined1 local_d1 [40];
  allocator<char> local_a9;
  string local_a8 [39];
  allocator<char> local_81;
  string local_80 [55];
  allocator<char> local_49;
  string local_48 [72];
  
  fVar5 = (float)((ulong)in_stack_fffffffffffffcc8 >> 0x20);
  std::__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1a82ea);
  std::make_shared<pbrt::DisneyMaterial,std::__cxx11::string&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
  std::__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1a8313);
  std::__shared_ptr_access<pbrt::DisneyMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<pbrt::DisneyMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1a8328);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),in_stack_fffffffffffffc68
             ,in_stack_fffffffffffffc60);
  syntactic::ParamSet::getParam3f
            ((ParamSet *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
             in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  std::__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1a83ad);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),in_stack_fffffffffffffc68
             ,in_stack_fffffffffffffc60);
  fVar4 = syntactic::ParamSet::getParam1f
                    (in_stack_fffffffffffffcd8,
                     (string *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),fVar5);
  peVar2 = std::__shared_ptr_access<pbrt::DisneyMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<pbrt::DisneyMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1a8418);
  peVar2->anisotropic = fVar4;
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator(&local_81);
  std::__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1a844d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),in_stack_fffffffffffffc68
             ,in_stack_fffffffffffffc60);
  fVar4 = syntactic::ParamSet::getParam1f
                    (in_stack_fffffffffffffcd8,
                     (string *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),fVar5);
  peVar2 = std::__shared_ptr_access<pbrt::DisneyMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<pbrt::DisneyMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1a84b8);
  peVar2->clearCoat = fVar4;
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator(&local_a9);
  name = std::
         __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)0x1a84ed);
  this_00 = (ParamSet *)local_d1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),in_stack_fffffffffffffc68
             ,in_stack_fffffffffffffc60);
  fVar4 = syntactic::ParamSet::getParam1f
                    (in_stack_fffffffffffffcd8,
                     (string *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),fVar5);
  peVar2 = std::__shared_ptr_access<pbrt::DisneyMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<pbrt::DisneyMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1a855d);
  peVar2->clearCoatGloss = fVar4;
  std::__cxx11::string::~string((string *)(local_d1 + 1));
  fallBack = (undefined1)((uint)fVar4 >> 0x18);
  std::allocator<char>::~allocator((allocator<char> *)local_d1);
  std::__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1a8592);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),in_stack_fffffffffffffc68
             ,in_stack_fffffffffffffc60);
  fVar4 = syntactic::ParamSet::getParam1f
                    (in_stack_fffffffffffffcd8,
                     (string *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),fVar5);
  peVar2 = std::__shared_ptr_access<pbrt::DisneyMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<pbrt::DisneyMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1a8602);
  peVar2->diffTrans = fVar4;
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator(&local_f9);
  std::__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1a8637);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),in_stack_fffffffffffffc68
             ,in_stack_fffffffffffffc60);
  fVar4 = syntactic::ParamSet::getParam1f
                    (in_stack_fffffffffffffcd8,
                     (string *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),fVar5);
  peVar2 = std::__shared_ptr_access<pbrt::DisneyMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<pbrt::DisneyMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1a86a7);
  peVar2->eta = fVar4;
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator(&local_121);
  peVar3 = std::
           __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1a86dc);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),in_stack_fffffffffffffc68
             ,in_stack_fffffffffffffc60);
  fVar5 = syntactic::ParamSet::getParam1f
                    (&peVar3->super_ParamSet,
                     (string *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),fVar5);
  peVar2 = std::__shared_ptr_access<pbrt::DisneyMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<pbrt::DisneyMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1a874c);
  peVar2->flatness = fVar5;
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator(&local_149);
  std::__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1a8781);
  fVar4 = (float)((ulong)&local_171 >> 0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),in_stack_fffffffffffffc68
             ,in_stack_fffffffffffffc60);
  fVar6 = syntactic::ParamSet::getParam1f
                    (&peVar3->super_ParamSet,(string *)CONCAT44(fVar5,in_stack_fffffffffffffcd0),
                     fVar4);
  peVar2 = std::__shared_ptr_access<pbrt::DisneyMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<pbrt::DisneyMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1a87ec);
  peVar2->metallic = fVar6;
  std::__cxx11::string::~string(local_170);
  std::allocator<char>::~allocator(&local_171);
  std::__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1a8821);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),in_stack_fffffffffffffc68
             ,in_stack_fffffffffffffc60);
  fVar6 = syntactic::ParamSet::getParam1f
                    (&peVar3->super_ParamSet,(string *)CONCAT44(fVar5,in_stack_fffffffffffffcd0),
                     fVar4);
  peVar2 = std::__shared_ptr_access<pbrt::DisneyMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<pbrt::DisneyMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1a888e);
  peVar2->roughness = fVar6;
  std::__cxx11::string::~string(local_198);
  std::allocator<char>::~allocator(&local_199);
  std::__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1a88c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),in_stack_fffffffffffffc68
             ,in_stack_fffffffffffffc60);
  fVar6 = syntactic::ParamSet::getParam1f
                    (&peVar3->super_ParamSet,(string *)CONCAT44(fVar5,in_stack_fffffffffffffcd0),
                     fVar4);
  peVar2 = std::__shared_ptr_access<pbrt::DisneyMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<pbrt::DisneyMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1a8921);
  peVar2->sheen = fVar6;
  std::__cxx11::string::~string(local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  std::__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1a8953);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),in_stack_fffffffffffffc68
             ,in_stack_fffffffffffffc60);
  fVar6 = syntactic::ParamSet::getParam1f
                    (&peVar3->super_ParamSet,(string *)CONCAT44(fVar5,in_stack_fffffffffffffcd0),
                     fVar4);
  peVar2 = std::__shared_ptr_access<pbrt::DisneyMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<pbrt::DisneyMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1a89b4);
  peVar2->sheenTint = fVar6;
  std::__cxx11::string::~string(local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  __a = std::
        __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1a89e6);
  __s = &local_211;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(fVar6,in_stack_fffffffffffffc70),(char *)__s,(allocator<char> *)__a);
  fVar7 = syntactic::ParamSet::getParam1f
                    (&peVar3->super_ParamSet,(string *)CONCAT44(fVar5,in_stack_fffffffffffffcd0),
                     fVar4);
  peVar2 = std::__shared_ptr_access<pbrt::DisneyMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<pbrt::DisneyMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1a8a42);
  peVar2->specTrans = fVar7;
  std::__cxx11::string::~string(local_210);
  std::allocator<char>::~allocator(&local_211);
  std::__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1a8a74);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(fVar6,in_stack_fffffffffffffc70),(char *)__s,(allocator<char> *)__a);
  fVar4 = syntactic::ParamSet::getParam1f
                    (&peVar3->super_ParamSet,(string *)CONCAT44(fVar5,in_stack_fffffffffffffcd0),
                     fVar4);
  peVar2 = std::__shared_ptr_access<pbrt::DisneyMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<pbrt::DisneyMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1a8ad0);
  peVar2->specularTint = fVar4;
  std::__cxx11::string::~string(local_238);
  std::allocator<char>::~allocator(&local_239);
  peVar3 = std::
           __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1a8b02);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(fVar6,in_stack_fffffffffffffc70),(char *)__s,(allocator<char> *)__a);
  bVar1 = syntactic::ParamSet::getParamBool(this_00,(string *)name,(bool)fallBack);
  peVar2 = std::__shared_ptr_access<pbrt::DisneyMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<pbrt::DisneyMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1a8b5e);
  peVar2->thin = (bool)(bVar1 & 1);
  std::__cxx11::string::~string(local_260);
  std::allocator<char>::~allocator(&local_261);
  std::shared_ptr<pbrt::Material>::shared_ptr<pbrt::DisneyMaterial,void>
            ((shared_ptr<pbrt::Material> *)peVar3,
             (shared_ptr<pbrt::DisneyMaterial> *)CONCAT17(bVar1,in_stack_fffffffffffffc28));
  std::shared_ptr<pbrt::DisneyMaterial>::~shared_ptr((shared_ptr<pbrt::DisneyMaterial> *)0x1a8ba4);
  SVar8.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  SVar8.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (SP)SVar8.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Material::SP SemanticParser::createMaterial_disney(pbrt::syntactic::Material::SP in)
  {
    DisneyMaterial::SP mat = std::make_shared<DisneyMaterial>(in->name);

    in->getParam3f(&mat->color.x,"color");
    mat->anisotropic    = in->getParam1f("anisotropic",    0.f );
    mat->clearCoat      = in->getParam1f("clearcoat",      0.f );
    mat->clearCoatGloss = in->getParam1f("clearcoatgloss", 1.f );
    mat->diffTrans      = in->getParam1f("difftrans",      1.35f );
    mat->eta            = in->getParam1f("eta",            1.2f );
    mat->flatness       = in->getParam1f("flatness",       0.2f );
    mat->metallic       = in->getParam1f("metallic",       0.f );
    mat->roughness      = in->getParam1f("roughness",      0.9f );
    mat->sheen          = in->getParam1f("sheen",          0.3f );
    mat->sheenTint      = in->getParam1f("sheentint",      0.68f );
    mat->specTrans      = in->getParam1f("spectrans",      0.f );
    mat->specularTint   = in->getParam1f("speculartint",   0.f );
    mat->thin           = in->getParamBool("thin",           true);
    return mat;
  }